

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

bool __thiscall
glcts::TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet
          (TessellationShaderInvarianceRule7Test *this,float *base_triangle_data,float *vertex_data,
          uint vertex_data_n_vertices)

{
  bool bVar1;
  ulong uVar2;
  
  if (2 < vertex_data_n_vertices) {
    uVar2 = 0;
    do {
      bVar1 = TessellationShaderUtils::isTriangleDefined
                        (vertex_data + (uVar2 & 0xffffffff),base_triangle_data);
      if (bVar1) {
        return true;
      }
      bVar1 = ((ulong)vertex_data_n_vertices / 3) * 9 - 9 != uVar2;
      uVar2 = uVar2 + 9;
    } while (bVar1);
  }
  return false;
}

Assistant:

bool TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet(const float* base_triangle_data,
																			 const float* vertex_data,
																			 unsigned int vertex_data_n_vertices)
{
	bool result = false;

	for (unsigned int n_triangle = 0; n_triangle < vertex_data_n_vertices / 3 /* vertices per triangle */; n_triangle++)
	{
		const float* current_triangle_data = vertex_data +
											 n_triangle * 3 * /* vertices per triangle */
												 3;			  /* components */

		if (TessellationShaderUtils::isTriangleDefined(current_triangle_data, base_triangle_data))
		{
			result = true;

			break;
		}
	} /* for (all vertices) */

	return result;
}